

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wf.h
# Opt level: O2

void __thiscall
trieste::wf::Gen::Gen
          (Gen *this,TokenTerminalDistance *token_terminal_distance_,GenNodeLocationF *gloc_,
          Seed seed_,size_t target_depth_,double alpha_)

{
  CLI::std::
  _Rb_tree<trieste::Token,_std::pair<const_trieste::Token,_unsigned_long>,_std::_Select1st<std::pair<const_trieste::Token,_unsigned_long>_>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_unsigned_long>_>_>
  ::_Rb_tree((_Rb_tree<trieste::Token,_std::pair<const_trieste::Token,_unsigned_long>,_std::_Select1st<std::pair<const_trieste::Token,_unsigned_long>_>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_unsigned_long>_>_>
              *)this,&token_terminal_distance_->_M_t);
  CLI::std::
  function<trieste::Location_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&,_std::shared_ptr<trieste::NodeDef>)>
  ::function((function<trieste::Location_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&,_std::shared_ptr<trieste::NodeDef>)>
              *)&this->gloc,gloc_);
  xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>::XorOshiro
            (&this->rand,seed_,0);
  this->target_depth = target_depth_;
  this->alpha = alpha_;
  return;
}

Assistant:

Gen(
        TokenTerminalDistance token_terminal_distance_,
        GenNodeLocationF gloc_,
        Seed seed_,
        size_t target_depth_,
        double alpha_ = 1)
      : token_terminal_distance(token_terminal_distance_),
        gloc(gloc_),
        rand(seed_),
        target_depth(target_depth_),
        alpha(alpha_)
      {}